

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argument.hpp
# Opt level: O0

unsigned_long * __thiscall
boost::runtime::arguments_store::get<unsigned_long>(arguments_store *this,cstring *parameter_name)

{
  bool bVar1;
  type paVar2;
  specific_param_error<boost::runtime::arg_type_mismatch,_boost::runtime::init_error> *this_00;
  type paVar3;
  argument_ptr arg;
  const_iterator found;
  shared_ptr<boost::runtime::argument> *in_stack_fffffffffffffdf8;
  basic_cstring<const_char> *in_stack_fffffffffffffe00;
  cstring *in_stack_fffffffffffffe08;
  cstring *pcVar4;
  access_to_missing_argument *in_stack_fffffffffffffe10;
  specific_param_error<boost::runtime::arg_type_mismatch,_boost::runtime::init_error> *this_01;
  specific_param_error<boost::runtime::access_to_missing_argument,_boost::runtime::init_error>
  *in_stack_fffffffffffffe18;
  basic_cstring<const_char> *in_stack_fffffffffffffe50;
  specific_param_error<boost::runtime::access_to_missing_argument,_boost::runtime::init_error>
  *in_stack_fffffffffffffe58;
  cstring local_108 [13];
  iterator local_30;
  _Rb_tree_const_iterator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>_>_>
  local_28;
  iterator local_20;
  _Rb_tree_const_iterator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>_>_>
  local_18 [3];
  
  local_20._M_node =
       (_Base_ptr)
       std::
       map<boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>,_std::less<boost::unit_test::basic_cstring<const_char>_>,_std::allocator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>_>_>_>
       ::find((map<boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>,_std::less<boost::unit_test::basic_cstring<const_char>_>,_std::allocator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>_>_>_>
               *)in_stack_fffffffffffffdf8,(key_type *)0x28d7be);
  std::
  _Rb_tree_const_iterator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>_>_>
  ::_Rb_tree_const_iterator(local_18,&local_20);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>,_std::less<boost::unit_test::basic_cstring<const_char>_>,_std::allocator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>_>_>_>
       ::end((map<boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>,_std::less<boost::unit_test::basic_cstring<const_char>_>,_std::allocator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>_>_>_>
              *)in_stack_fffffffffffffdf8);
  std::
  _Rb_tree_const_iterator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>_>_>
  ::_Rb_tree_const_iterator(&local_28,&local_30);
  bVar1 = std::operator!=(local_18,&local_28);
  if (!bVar1) {
    unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffe00);
    access_to_missing_argument::access_to_missing_argument
              (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    specific_param_error<boost::runtime::access_to_missing_argument,_boost::runtime::init_error>::
    operator<<(in_stack_fffffffffffffe18,(char *)in_stack_fffffffffffffe10);
    specific_param_error<boost::runtime::access_to_missing_argument,boost::runtime::init_error>::
    operator<<(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
    unit_test::ut_detail::throw_exception<boost::runtime::access_to_missing_argument>
              (in_stack_fffffffffffffe10);
  }
  std::
  _Rb_tree_const_iterator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>_>_>
  ::operator->((_Rb_tree_const_iterator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>_>_>
                *)0x28d90a);
  pcVar4 = local_108;
  shared_ptr<boost::runtime::argument>::shared_ptr
            ((shared_ptr<boost::runtime::argument> *)in_stack_fffffffffffffe00,
             in_stack_fffffffffffffdf8);
  paVar2 = shared_ptr<boost::runtime::argument>::operator->
                     ((shared_ptr<boost::runtime::argument> *)in_stack_fffffffffffffe00);
  this_01 = (specific_param_error<boost::runtime::arg_type_mismatch,_boost::runtime::init_error> *)
            paVar2->p_value_type;
  this_00 = (specific_param_error<boost::runtime::arg_type_mismatch,_boost::runtime::init_error> *)
            rtti::type_id<unsigned_long>();
  if (this_01 == this_00) {
    paVar3 = shared_ptr<boost::runtime::argument>::operator*
                       ((shared_ptr<boost::runtime::argument> *)in_stack_fffffffffffffe00);
    paVar3 = paVar3 + 1;
    shared_ptr<boost::runtime::argument>::~shared_ptr
              ((shared_ptr<boost::runtime::argument> *)0x28da5b);
    return (unsigned_long *)paVar3;
  }
  unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffe00);
  arg_type_mismatch::arg_type_mismatch((arg_type_mismatch *)this_01,pcVar4);
  specific_param_error<boost::runtime::arg_type_mismatch,_boost::runtime::init_error>::operator<<
            (this_00,(char *)this_01);
  specific_param_error<boost::runtime::arg_type_mismatch,boost::runtime::init_error>::operator<<
            ((specific_param_error<boost::runtime::arg_type_mismatch,_boost::runtime::init_error> *)
             in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  unit_test::ut_detail::throw_exception<boost::runtime::arg_type_mismatch>
            ((arg_type_mismatch *)this_01);
}

Assistant:

T&          get( cstring parameter_name ) {
        storage_type::const_iterator found = m_arguments.find( parameter_name );
        BOOST_TEST_I_ASSRT( found != m_arguments.end(),
                            access_to_missing_argument() 
                                << "There is no argument provided for parameter "
                                << parameter_name );

        argument_ptr arg = found->second;

        BOOST_TEST_I_ASSRT( arg->p_value_type == rtti::type_id<T>(),
                            arg_type_mismatch()
                                << "Access with invalid type for argument corresponding to parameter "
                                << parameter_name );

        return static_cast<typed_argument<T>&>( *arg ).p_value.value;
    }